

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

void __thiscall QAbstractScrollArea::keyPressEvent(QAbstractScrollArea *this,QKeyEvent *e)

{
  long lVar1;
  char cVar2;
  QKeyEvent QVar3;
  LayoutDirection LVar4;
  SliderAction action;
  QAbstractSlider *this_00;
  
  lVar1 = *(long *)(this + 8);
  if (e == (QKeyEvent *)0x0) {
LAB_003938f6:
    switch(*(undefined4 *)(e + 0x40)) {
    case 0x1000012:
      this_00 = *(QAbstractSlider **)(lVar1 + 0x288);
      LVar4 = QWidget::layoutDirection((QWidget *)this);
      action = (LVar4 == LeftToRight) + SliderSingleStepAdd;
      break;
    case 0x1000013:
      this_00 = *(QAbstractSlider **)(lVar1 + 0x290);
      action = SliderSingleStepSub;
      break;
    case 0x1000014:
      this_00 = *(QAbstractSlider **)(lVar1 + 0x288);
      LVar4 = QWidget::layoutDirection((QWidget *)this);
      action = SliderSingleStepSub - (LVar4 == LeftToRight);
      break;
    case 0x1000015:
      this_00 = *(QAbstractSlider **)(lVar1 + 0x290);
      action = SliderSingleStepAdd;
      break;
    default:
      QVar3 = (QKeyEvent)0x0;
      goto LAB_0039396d;
    }
  }
  else {
    cVar2 = QKeyEvent::matches((StandardKey)e);
    if (cVar2 == '\0') {
      if ((e == (QKeyEvent *)0x0) || (cVar2 = QKeyEvent::matches((StandardKey)e), cVar2 == '\0'))
      goto LAB_003938f6;
      this_00 = *(QAbstractSlider **)(lVar1 + 0x290);
      action = SliderPageStepAdd;
    }
    else {
      this_00 = *(QAbstractSlider **)(lVar1 + 0x290);
      action = SliderPageStepSub;
    }
  }
  QAbstractSlider::triggerAction(this_00,action);
  QVar3 = (QKeyEvent)0x1;
LAB_0039396d:
  e[0xc] = QVar3;
  return;
}

Assistant:

void QAbstractScrollArea::keyPressEvent(QKeyEvent * e)
{
    Q_D(QAbstractScrollArea);
    if (false){
#ifndef QT_NO_SHORTCUT
    } else if (e == QKeySequence::MoveToPreviousPage) {
        d->vbar->triggerAction(QScrollBar::SliderPageStepSub);
    } else if (e == QKeySequence::MoveToNextPage) {
        d->vbar->triggerAction(QScrollBar::SliderPageStepAdd);
#endif
    } else {
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            e->ignore();
            return;
        }
#endif
        switch (e->key()) {
        case Qt::Key_Up:
            d->vbar->triggerAction(QScrollBar::SliderSingleStepSub);
            break;
        case Qt::Key_Down:
            d->vbar->triggerAction(QScrollBar::SliderSingleStepAdd);
            break;
        case Qt::Key_Left:
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && hasEditFocus()
            && (!d->hbar->isVisible() || d->hbar->value() == d->hbar->minimum())) {
            //if we aren't using the hbar or we are already at the leftmost point ignore
            e->ignore();
            return;
        }
#endif
            d->hbar->triggerAction(
                layoutDirection() == Qt::LeftToRight
                ? QScrollBar::SliderSingleStepSub : QScrollBar::SliderSingleStepAdd);
            break;
        case Qt::Key_Right:
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && hasEditFocus()
            && (!d->hbar->isVisible() || d->hbar->value() == d->hbar->maximum())) {
            //if we aren't using the hbar or we are already at the rightmost point ignore
            e->ignore();
            return;
        }
#endif
            d->hbar->triggerAction(
                layoutDirection() == Qt::LeftToRight
                ? QScrollBar::SliderSingleStepAdd : QScrollBar::SliderSingleStepSub);
            break;
        default:
            e->ignore();
            return;
        }
    }
    e->accept();
}